

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestReportResults::Run(TestReportResults *this)

{
  difference_type dVar1;
  Results rs;
  TestReportResultsInternal test1;
  RunParams local_1648;
  TestReportResultsInternal test0;
  ostringstream oss;
  TestRegistry r;
  
  testinator::TestRegistry::TestRegistry(&r);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&test0);
  std::__cxx11::string::string((string *)&test1,"expected_fail",(allocator *)&rs);
  TestReportResultsInternal::TestReportResultsInternal(&test0,&r,(string *)&test1,true);
  std::__cxx11::string::~string((string *)&test1);
  std::__cxx11::string::string((string *)&rs,"expected_pass",(allocator *)&local_1648);
  TestReportResultsInternal::TestReportResultsInternal(&test1,&r,(string *)&rs,false);
  std::__cxx11::string::~string((string *)&rs);
  local_1648.m_flags = 0;
  local_1648._4_4_ = 0;
  local_1648.m_numPropertyChecks = 100;
  local_1648.m_randomSeed = 0;
  testinator::TestRegistry::RunAllTests(&rs,&r,&local_1648,(Outputter *)test0.super_Test._vptr_Test)
  ;
  dVar1 = std::
          __count_if<__gnu_cxx::__normal_iterator<testinator::Result*,std::vector<testinator::Result,std::allocator<testinator::Result>>>,__gnu_cxx::__ops::_Iter_pred<TestReportResults::Run()::_lambda(testinator::Result_const&)_1_>>
                    (rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector(&rs);
  testinator::Test::~Test(&test1.super_Test);
  testinator::Test::~Test(&test0.super_Test);
  if (test0.super_Test._vptr_Test != (_func_int **)0x0) {
    (**(code **)(*test0.super_Test._vptr_Test + 0x40))(test0.super_Test._vptr_Test);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  testinator::TestRegistry::~TestRegistry(&r);
  return (long)rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
               _M_impl.super__Vector_impl_data._M_start == 0x90 && dVar1 == 1;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);

    TestReportResultsInternal test0(r, "expected_fail", true);
    TestReportResultsInternal test1(r, "expected_pass", false);
    testinator::Results rs = r.RunAllTests(testinator::RunParams(), op.get());
    auto numPassed = count_if(rs.begin(), rs.end(),
                              [] (const testinator::Result& res)
                              { return res.m_success; });
    auto total = decltype(numPassed)(rs.size());
    auto numFailed = total - numPassed;
    return numPassed == 1 && numFailed == 1;
  }